

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xpath_node *
pugi::impl::(anonymous_namespace)::unique<pugi::xpath_node*>(xpath_node *begin,xpath_node *end)

{
  xpath_node *pxVar1;
  bool bVar2;
  bool local_29;
  xpath_node *local_28;
  xpath_node *write;
  xpath_node *end_local;
  xpath_node *begin_local;
  
  end_local = begin;
  while( true ) {
    local_29 = false;
    if (1 < (long)end - (long)end_local >> 4) {
      local_29 = xpath_node::operator!=(end_local,end_local + 1);
    }
    if (local_29 == false) break;
    end_local = end_local + 1;
  }
  if (end_local == end) {
    begin_local = end_local;
  }
  else {
    local_28 = end_local;
    while (pxVar1 = end_local, end_local = pxVar1 + 1, end_local != end) {
      bVar2 = xpath_node::operator!=(end_local,local_28);
      if (bVar2) {
        local_28[1]._node._root = (end_local->_node)._root;
        local_28[1]._attribute._attr = pxVar1[1]._attribute._attr;
        local_28 = local_28 + 1;
      }
    }
    begin_local = local_28 + 1;
  }
  return begin_local;
}

Assistant:

PUGI__FN I unique(I begin, I end)
	{
		// fast skip head
		while (end - begin > 1 && *begin != *(begin + 1))
			begin++;

		if (begin == end)
			return begin;

		// last written element
		I write = begin++;

		// merge unique elements
		while (begin != end)
		{
			if (*begin != *write)
				*++write = *begin++;
			else
				begin++;
		}

		// past-the-end (write points to live element)
		return write + 1;
	}